

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  num_writer f;
  int num_digits;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  string_view prefix;
  string groups;
  undefined7 uStack_5f;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  duckdb_fmt::v6::internal::grouping_impl<char>((locale_ref)&local_40);
  if (local_38 == 0) {
    on_dec(this);
  }
  else {
    cVar2 = this->specs->thousands;
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      uVar4 = this->abs_value;
      uVar9 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar10 = (uVar9 + 1) -
               (uint)(uVar4 < *(uint *)((long)&basic_data<void>::zero_or_powers_of_10_32 +
                                       (ulong)uVar9 * 4));
      pcVar1 = local_40 + local_38;
      iVar11 = (int)local_38 + iVar10;
      pcVar5 = local_40;
      iVar7 = iVar10;
      do {
        cVar3 = *pcVar5;
        iVar8 = iVar7 - cVar3;
        pcVar6 = pcVar5;
        num_digits = iVar10;
        if ((iVar8 == 0 || iVar7 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
        iVar10 = iVar10 + 1;
        pcVar5 = pcVar5 + 1;
        local_38 = local_38 + -1;
        pcVar6 = pcVar1;
        iVar7 = iVar8;
        num_digits = iVar11;
      } while (local_38 != 0);
      if (pcVar6 == pcVar1) {
        num_digits = (iVar7 + -1) / (int)pcVar1[-1] + num_digits;
      }
      f._17_7_ = uStack_5f;
      f.sep = cVar2;
      f.size = num_digits;
      f.abs_value = uVar4;
      f.groups = (string *)&local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }